

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MXF.cpp
# Opt level: O2

void __thiscall
ASDCP::MXF::AS02_MCAConfigParser::AS02_MCAConfigParser(AS02_MCAConfigParser *this,Dictionary *d)

{
  mca_label_map_t *this_00;
  MDDEntry *pMVar1;
  uint uVar2;
  char name_buf [64];
  label_traits local_3e0;
  byte_t local_394 [3];
  allocator<char> local_391;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>
  local_390;
  char symbol_buf [64];
  byte_t abStack_2e8 [5];
  byte_t local_2e3 [3];
  byte_t abStack_2e0 [16];
  UL local_2d0;
  string local_2b0;
  UL local_290;
  UL local_270;
  UL local_250;
  UL local_230;
  UL local_210;
  UL local_1f0;
  UL local_1d0;
  UL local_1b0;
  UL local_190;
  UL local_170;
  UL local_150;
  UL local_130;
  UL local_110;
  UL local_f0;
  UL local_d0;
  UL local_b0;
  UL local_90;
  UL local_70;
  UL local_50;
  
  ASDCP_MCAConfigParser::ASDCP_MCAConfigParser(&this->super_ASDCP_MCAConfigParser,d);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)name_buf,"Mono One",(allocator<char> *)symbol_buf);
  pMVar1 = Dictionary::Type((this->super_ASDCP_MCAConfigParser).m_Dict,MDD_IMFAudioChannel_M1);
  local_50.super_Identifier<16U>.m_HasValue = true;
  local_50.super_Identifier<16U>.m_Value._0_8_ = *(undefined8 *)pMVar1->ul;
  local_50.super_Identifier<16U>.m_Value._8_8_ = *(undefined8 *)(pMVar1->ul + 8);
  local_50.super_Identifier<16U>.super_IArchive._vptr_IArchive =
       (_func_int **)&PTR__IArchive_002112c8;
  label_traits::label_traits(&local_3e0,(string *)name_buf,true,&local_50);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>
  ::pair<const_char_(&)[3],_ASDCP::MXF::label_traits,_true>
            (&local_390,(char (*) [3])0x1d765a,&local_3e0);
  this_00 = &(this->super_ASDCP_MCAConfigParser).m_LabelMap;
  std::
  _Rb_tree<std::__cxx11::string_const,std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>,std::_Select1st<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>,ASDCP::MXF::ci_comp,std::allocator<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>
            ((_Rb_tree<std::__cxx11::string_const,std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>,std::_Select1st<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>,ASDCP::MXF::ci_comp,std::allocator<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>>
              *)this_00,&local_390);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>
  ::~pair(&local_390);
  std::__cxx11::string::~string((string *)&local_3e0);
  std::__cxx11::string::~string((string *)name_buf);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)name_buf,"Mono Two",(allocator<char> *)symbol_buf);
  pMVar1 = Dictionary::Type((this->super_ASDCP_MCAConfigParser).m_Dict,MDD_IMFAudioChannel_M2);
  local_70.super_Identifier<16U>.m_HasValue = true;
  local_70.super_Identifier<16U>.m_Value._0_8_ = *(undefined8 *)pMVar1->ul;
  local_70.super_Identifier<16U>.m_Value._8_8_ = *(undefined8 *)(pMVar1->ul + 8);
  local_70.super_Identifier<16U>.super_IArchive._vptr_IArchive =
       (_func_int **)&PTR__IArchive_002112c8;
  label_traits::label_traits(&local_3e0,(string *)name_buf,true,&local_70);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>
  ::pair<const_char_(&)[3],_ASDCP::MXF::label_traits,_true>
            (&local_390,(char (*) [3])0x1d766d,&local_3e0);
  std::
  _Rb_tree<std::__cxx11::string_const,std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>,std::_Select1st<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>,ASDCP::MXF::ci_comp,std::allocator<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>
            ((_Rb_tree<std::__cxx11::string_const,std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>,std::_Select1st<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>,ASDCP::MXF::ci_comp,std::allocator<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>>
              *)this_00,&local_390);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>
  ::~pair(&local_390);
  std::__cxx11::string::~string((string *)&local_3e0);
  std::__cxx11::string::~string((string *)name_buf);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)name_buf,"Left Total",(allocator<char> *)symbol_buf);
  pMVar1 = Dictionary::Type((this->super_ASDCP_MCAConfigParser).m_Dict,MDD_IMFAudioChannel_Lt);
  local_90.super_Identifier<16U>.m_HasValue = true;
  local_90.super_Identifier<16U>.m_Value._0_8_ = *(undefined8 *)pMVar1->ul;
  local_90.super_Identifier<16U>.m_Value._8_8_ = *(undefined8 *)(pMVar1->ul + 8);
  local_90.super_Identifier<16U>.super_IArchive._vptr_IArchive =
       (_func_int **)&PTR__IArchive_002112c8;
  label_traits::label_traits(&local_3e0,(string *)name_buf,true,&local_90);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>
  ::pair<const_char_(&)[3],_ASDCP::MXF::label_traits,_true>
            (&local_390,(char (*) [3])0x1d7680,&local_3e0);
  std::
  _Rb_tree<std::__cxx11::string_const,std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>,std::_Select1st<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>,ASDCP::MXF::ci_comp,std::allocator<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>
            ((_Rb_tree<std::__cxx11::string_const,std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>,std::_Select1st<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>,ASDCP::MXF::ci_comp,std::allocator<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>>
              *)this_00,&local_390);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>
  ::~pair(&local_390);
  std::__cxx11::string::~string((string *)&local_3e0);
  std::__cxx11::string::~string((string *)name_buf);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)name_buf,"Right Total",(allocator<char> *)symbol_buf);
  pMVar1 = Dictionary::Type((this->super_ASDCP_MCAConfigParser).m_Dict,MDD_IMFAudioChannel_Rt);
  local_b0.super_Identifier<16U>.m_HasValue = true;
  local_b0.super_Identifier<16U>.m_Value._0_8_ = *(undefined8 *)pMVar1->ul;
  local_b0.super_Identifier<16U>.m_Value._8_8_ = *(undefined8 *)(pMVar1->ul + 8);
  local_b0.super_Identifier<16U>.super_IArchive._vptr_IArchive =
       (_func_int **)&PTR__IArchive_002112c8;
  label_traits::label_traits(&local_3e0,(string *)name_buf,true,&local_b0);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>
  ::pair<const_char_(&)[3],_ASDCP::MXF::label_traits,_true>
            (&local_390,(char (*) [3])0x1db6a2,&local_3e0);
  std::
  _Rb_tree<std::__cxx11::string_const,std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>,std::_Select1st<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>,ASDCP::MXF::ci_comp,std::allocator<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>
            ((_Rb_tree<std::__cxx11::string_const,std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>,std::_Select1st<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>,ASDCP::MXF::ci_comp,std::allocator<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>>
              *)this_00,&local_390);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>
  ::~pair(&local_390);
  std::__cxx11::string::~string((string *)&local_3e0);
  std::__cxx11::string::~string((string *)name_buf);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)name_buf,"Left Surround Total",(allocator<char> *)symbol_buf);
  pMVar1 = Dictionary::Type((this->super_ASDCP_MCAConfigParser).m_Dict,MDD_IMFAudioChannel_Lst);
  local_d0.super_Identifier<16U>.m_HasValue = true;
  local_d0.super_Identifier<16U>.m_Value._0_8_ = *(undefined8 *)pMVar1->ul;
  local_d0.super_Identifier<16U>.m_Value._8_8_ = *(undefined8 *)(pMVar1->ul + 8);
  local_d0.super_Identifier<16U>.super_IArchive._vptr_IArchive =
       (_func_int **)&PTR__IArchive_002112c8;
  label_traits::label_traits(&local_3e0,(string *)name_buf,true,&local_d0);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>
  ::pair<const_char_(&)[4],_ASDCP::MXF::label_traits,_true>
            (&local_390,(char (*) [4])0x1d76a6,&local_3e0);
  std::
  _Rb_tree<std::__cxx11::string_const,std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>,std::_Select1st<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>,ASDCP::MXF::ci_comp,std::allocator<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>
            ((_Rb_tree<std::__cxx11::string_const,std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>,std::_Select1st<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>,ASDCP::MXF::ci_comp,std::allocator<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>>
              *)this_00,&local_390);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>
  ::~pair(&local_390);
  std::__cxx11::string::~string((string *)&local_3e0);
  std::__cxx11::string::~string((string *)name_buf);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)name_buf,"Right Surround Total",(allocator<char> *)symbol_buf);
  pMVar1 = Dictionary::Type((this->super_ASDCP_MCAConfigParser).m_Dict,MDD_IMFAudioChannel_Rst);
  local_f0.super_Identifier<16U>.m_HasValue = true;
  local_f0.super_Identifier<16U>.m_Value._0_8_ = *(undefined8 *)pMVar1->ul;
  local_f0.super_Identifier<16U>.m_Value._8_8_ = *(undefined8 *)(pMVar1->ul + 8);
  local_f0.super_Identifier<16U>.super_IArchive._vptr_IArchive =
       (_func_int **)&PTR__IArchive_002112c8;
  label_traits::label_traits(&local_3e0,(string *)name_buf,true,&local_f0);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>
  ::pair<const_char_(&)[4],_ASDCP::MXF::label_traits,_true>
            (&local_390,(char (*) [4])0x1d76ba,&local_3e0);
  std::
  _Rb_tree<std::__cxx11::string_const,std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>,std::_Select1st<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>,ASDCP::MXF::ci_comp,std::allocator<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>
            ((_Rb_tree<std::__cxx11::string_const,std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>,std::_Select1st<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>,ASDCP::MXF::ci_comp,std::allocator<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>>
              *)this_00,&local_390);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>
  ::~pair(&local_390);
  std::__cxx11::string::~string((string *)&local_3e0);
  std::__cxx11::string::~string((string *)name_buf);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)name_buf,"Surround",(allocator<char> *)symbol_buf);
  pMVar1 = Dictionary::Type((this->super_ASDCP_MCAConfigParser).m_Dict,MDD_IMFAudioChannel_S);
  local_110.super_Identifier<16U>.m_HasValue = true;
  local_110.super_Identifier<16U>.m_Value._0_8_ = *(undefined8 *)pMVar1->ul;
  local_110.super_Identifier<16U>.m_Value._8_8_ = *(undefined8 *)(pMVar1->ul + 8);
  local_110.super_Identifier<16U>.super_IArchive._vptr_IArchive =
       (_func_int **)&PTR__IArchive_002112c8;
  label_traits::label_traits(&local_3e0,(string *)name_buf,true,&local_110);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>
  ::pair<const_char_(&)[2],_ASDCP::MXF::label_traits,_true>
            (&local_390,(char (*) [2])0x1db69d,&local_3e0);
  std::
  _Rb_tree<std::__cxx11::string_const,std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>,std::_Select1st<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>,ASDCP::MXF::ci_comp,std::allocator<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>
            ((_Rb_tree<std::__cxx11::string_const,std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>,std::_Select1st<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>,ASDCP::MXF::ci_comp,std::allocator<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>>
              *)this_00,&local_390);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>
  ::~pair(&local_390);
  std::__cxx11::string::~string((string *)&local_3e0);
  std::__cxx11::string::~string((string *)name_buf);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)name_buf,"Standard Stereo",(allocator<char> *)symbol_buf);
  pMVar1 = Dictionary::Type((this->super_ASDCP_MCAConfigParser).m_Dict,MDD_IMFAudioSoundfield_ST);
  local_130.super_Identifier<16U>.m_HasValue = true;
  local_130.super_Identifier<16U>.m_Value._0_8_ = *(undefined8 *)pMVar1->ul;
  local_130.super_Identifier<16U>.m_Value._8_8_ = *(undefined8 *)(pMVar1->ul + 8);
  local_130.super_Identifier<16U>.super_IArchive._vptr_IArchive =
       (_func_int **)&PTR__IArchive_002112c8;
  label_traits::label_traits(&local_3e0,(string *)name_buf,true,&local_130);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>
  ::pair<const_char_(&)[3],_ASDCP::MXF::label_traits,_true>
            (&local_390,(char (*) [3])0x1e1843,&local_3e0);
  std::
  _Rb_tree<std::__cxx11::string_const,std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>,std::_Select1st<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>,ASDCP::MXF::ci_comp,std::allocator<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>
            ((_Rb_tree<std::__cxx11::string_const,std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>,std::_Select1st<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>,ASDCP::MXF::ci_comp,std::allocator<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>>
              *)this_00,&local_390);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>
  ::~pair(&local_390);
  std::__cxx11::string::~string((string *)&local_3e0);
  std::__cxx11::string::~string((string *)name_buf);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)name_buf,"Dual Mono",(allocator<char> *)symbol_buf);
  pMVar1 = Dictionary::Type((this->super_ASDCP_MCAConfigParser).m_Dict,MDD_IMFAudioSoundfield_DM);
  local_150.super_Identifier<16U>.m_HasValue = true;
  local_150.super_Identifier<16U>.m_Value._0_8_ = *(undefined8 *)pMVar1->ul;
  local_150.super_Identifier<16U>.m_Value._8_8_ = *(undefined8 *)(pMVar1->ul + 8);
  local_150.super_Identifier<16U>.super_IArchive._vptr_IArchive =
       (_func_int **)&PTR__IArchive_002112c8;
  label_traits::label_traits(&local_3e0,(string *)name_buf,true,&local_150);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>
  ::pair<const_char_(&)[3],_ASDCP::MXF::label_traits,_true>
            (&local_390,(char (*) [3])0x1d9289,&local_3e0);
  std::
  _Rb_tree<std::__cxx11::string_const,std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>,std::_Select1st<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>,ASDCP::MXF::ci_comp,std::allocator<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>
            ((_Rb_tree<std::__cxx11::string_const,std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>,std::_Select1st<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>,ASDCP::MXF::ci_comp,std::allocator<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>>
              *)this_00,&local_390);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>
  ::~pair(&local_390);
  std::__cxx11::string::~string((string *)&local_3e0);
  std::__cxx11::string::~string((string *)name_buf);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)name_buf,"Discrete Numbered Sources",(allocator<char> *)symbol_buf);
  pMVar1 = Dictionary::Type((this->super_ASDCP_MCAConfigParser).m_Dict,MDD_IMFAudioSoundfield_DNS);
  local_170.super_Identifier<16U>.m_HasValue = true;
  local_170.super_Identifier<16U>.m_Value._0_8_ = *(undefined8 *)pMVar1->ul;
  local_170.super_Identifier<16U>.m_Value._8_8_ = *(undefined8 *)(pMVar1->ul + 8);
  local_170.super_Identifier<16U>.super_IArchive._vptr_IArchive =
       (_func_int **)&PTR__IArchive_002112c8;
  label_traits::label_traits(&local_3e0,(string *)name_buf,true,&local_170);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>
  ::pair<const_char_(&)[4],_ASDCP::MXF::label_traits,_true>
            (&local_390,(char (*) [4])0x1d7728,&local_3e0);
  std::
  _Rb_tree<std::__cxx11::string_const,std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>,std::_Select1st<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>,ASDCP::MXF::ci_comp,std::allocator<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>
            ((_Rb_tree<std::__cxx11::string_const,std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>,std::_Select1st<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>,ASDCP::MXF::ci_comp,std::allocator<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>>
              *)this_00,&local_390);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>
  ::~pair(&local_390);
  std::__cxx11::string::~string((string *)&local_3e0);
  std::__cxx11::string::~string((string *)name_buf);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)name_buf,"3.0",(allocator<char> *)symbol_buf);
  pMVar1 = Dictionary::Type((this->super_ASDCP_MCAConfigParser).m_Dict,MDD_IMFAudioSoundfield_30);
  local_190.super_Identifier<16U>.m_HasValue = true;
  local_190.super_Identifier<16U>.m_Value._0_8_ = *(undefined8 *)pMVar1->ul;
  local_190.super_Identifier<16U>.m_Value._8_8_ = *(undefined8 *)(pMVar1->ul + 8);
  local_190.super_Identifier<16U>.super_IArchive._vptr_IArchive =
       (_func_int **)&PTR__IArchive_002112c8;
  label_traits::label_traits(&local_3e0,(string *)name_buf,true,&local_190);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>
  ::pair<const_char_(&)[3],_ASDCP::MXF::label_traits,_true>
            (&local_390,(char (*) [3])0x1d773f,&local_3e0);
  std::
  _Rb_tree<std::__cxx11::string_const,std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>,std::_Select1st<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>,ASDCP::MXF::ci_comp,std::allocator<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>
            ((_Rb_tree<std::__cxx11::string_const,std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>,std::_Select1st<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>,ASDCP::MXF::ci_comp,std::allocator<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>>
              *)this_00,&local_390);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>
  ::~pair(&local_390);
  std::__cxx11::string::~string((string *)&local_3e0);
  std::__cxx11::string::~string((string *)name_buf);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)name_buf,"4.0",(allocator<char> *)symbol_buf);
  pMVar1 = Dictionary::Type((this->super_ASDCP_MCAConfigParser).m_Dict,MDD_IMFAudioSoundfield_40);
  local_1b0.super_Identifier<16U>.m_HasValue = true;
  local_1b0.super_Identifier<16U>.m_Value._0_8_ = *(undefined8 *)pMVar1->ul;
  local_1b0.super_Identifier<16U>.m_Value._8_8_ = *(undefined8 *)(pMVar1->ul + 8);
  local_1b0.super_Identifier<16U>.super_IArchive._vptr_IArchive =
       (_func_int **)&PTR__IArchive_002112c8;
  label_traits::label_traits(&local_3e0,(string *)name_buf,true,&local_1b0);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>
  ::pair<const_char_(&)[3],_ASDCP::MXF::label_traits,_true>
            (&local_390,(char (*) [3])0x1d7755,&local_3e0);
  std::
  _Rb_tree<std::__cxx11::string_const,std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>,std::_Select1st<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>,ASDCP::MXF::ci_comp,std::allocator<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>
            ((_Rb_tree<std::__cxx11::string_const,std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>,std::_Select1st<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>,ASDCP::MXF::ci_comp,std::allocator<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>>
              *)this_00,&local_390);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>
  ::~pair(&local_390);
  std::__cxx11::string::~string((string *)&local_3e0);
  std::__cxx11::string::~string((string *)name_buf);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)name_buf,"5.0",(allocator<char> *)symbol_buf);
  pMVar1 = Dictionary::Type((this->super_ASDCP_MCAConfigParser).m_Dict,MDD_IMFAudioSoundfield_50);
  local_1d0.super_Identifier<16U>.m_HasValue = true;
  local_1d0.super_Identifier<16U>.m_Value._0_8_ = *(undefined8 *)pMVar1->ul;
  local_1d0.super_Identifier<16U>.m_Value._8_8_ = *(undefined8 *)(pMVar1->ul + 8);
  local_1d0.super_Identifier<16U>.super_IArchive._vptr_IArchive =
       (_func_int **)&PTR__IArchive_002112c8;
  label_traits::label_traits(&local_3e0,(string *)name_buf,true,&local_1d0);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>
  ::pair<const_char_(&)[3],_ASDCP::MXF::label_traits,_true>
            (&local_390,(char (*) [3])0x1d776b,&local_3e0);
  std::
  _Rb_tree<std::__cxx11::string_const,std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>,std::_Select1st<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>,ASDCP::MXF::ci_comp,std::allocator<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>
            ((_Rb_tree<std::__cxx11::string_const,std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>,std::_Select1st<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>,ASDCP::MXF::ci_comp,std::allocator<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>>
              *)this_00,&local_390);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>
  ::~pair(&local_390);
  std::__cxx11::string::~string((string *)&local_3e0);
  std::__cxx11::string::~string((string *)name_buf);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)name_buf,"6.0",(allocator<char> *)symbol_buf);
  pMVar1 = Dictionary::Type((this->super_ASDCP_MCAConfigParser).m_Dict,MDD_IMFAudioSoundfield_60);
  local_1f0.super_Identifier<16U>.m_HasValue = true;
  local_1f0.super_Identifier<16U>.m_Value._0_8_ = *(undefined8 *)pMVar1->ul;
  local_1f0.super_Identifier<16U>.m_Value._8_8_ = *(undefined8 *)(pMVar1->ul + 8);
  local_1f0.super_Identifier<16U>.super_IArchive._vptr_IArchive =
       (_func_int **)&PTR__IArchive_002112c8;
  label_traits::label_traits(&local_3e0,(string *)name_buf,true,&local_1f0);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>
  ::pair<const_char_(&)[3],_ASDCP::MXF::label_traits,_true>
            (&local_390,(char (*) [3])0x1d7781,&local_3e0);
  std::
  _Rb_tree<std::__cxx11::string_const,std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>,std::_Select1st<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>,ASDCP::MXF::ci_comp,std::allocator<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>
            ((_Rb_tree<std::__cxx11::string_const,std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>,std::_Select1st<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>,ASDCP::MXF::ci_comp,std::allocator<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>>
              *)this_00,&local_390);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>
  ::~pair(&local_390);
  std::__cxx11::string::~string((string *)&local_3e0);
  std::__cxx11::string::~string((string *)name_buf);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)name_buf,"7.0DS",(allocator<char> *)symbol_buf);
  pMVar1 = Dictionary::Type((this->super_ASDCP_MCAConfigParser).m_Dict,MDD_IMFAudioSoundfield_70);
  local_210.super_Identifier<16U>.m_HasValue = true;
  local_210.super_Identifier<16U>.m_Value._0_8_ = *(undefined8 *)pMVar1->ul;
  local_210.super_Identifier<16U>.m_Value._8_8_ = *(undefined8 *)(pMVar1->ul + 8);
  local_210.super_Identifier<16U>.super_IArchive._vptr_IArchive =
       (_func_int **)&PTR__IArchive_002112c8;
  label_traits::label_traits(&local_3e0,(string *)name_buf,true,&local_210);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>
  ::pair<const_char_(&)[3],_ASDCP::MXF::label_traits,_true>
            (&local_390,(char (*) [3])0x1d97d8,&local_3e0);
  std::
  _Rb_tree<std::__cxx11::string_const,std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>,std::_Select1st<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>,ASDCP::MXF::ci_comp,std::allocator<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>
            ((_Rb_tree<std::__cxx11::string_const,std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>,std::_Select1st<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>,ASDCP::MXF::ci_comp,std::allocator<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>>
              *)this_00,&local_390);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>
  ::~pair(&local_390);
  std::__cxx11::string::~string((string *)&local_3e0);
  std::__cxx11::string::~string((string *)name_buf);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)name_buf,"Lt-Rt",(allocator<char> *)symbol_buf);
  pMVar1 = Dictionary::Type((this->super_ASDCP_MCAConfigParser).m_Dict,MDD_IMFAudioSoundfield_LtRt);
  local_230.super_Identifier<16U>.m_HasValue = true;
  local_230.super_Identifier<16U>.m_Value._0_8_ = *(undefined8 *)pMVar1->ul;
  local_230.super_Identifier<16U>.m_Value._8_8_ = *(undefined8 *)(pMVar1->ul + 8);
  local_230.super_Identifier<16U>.super_IArchive._vptr_IArchive =
       (_func_int **)&PTR__IArchive_002112c8;
  label_traits::label_traits(&local_3e0,(string *)name_buf,true,&local_230);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>
  ::pair<const_char_(&)[5],_ASDCP::MXF::label_traits,_true>
            (&local_390,(char (*) [5])0x1d77ad,&local_3e0);
  std::
  _Rb_tree<std::__cxx11::string_const,std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>,std::_Select1st<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>,ASDCP::MXF::ci_comp,std::allocator<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>
            ((_Rb_tree<std::__cxx11::string_const,std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>,std::_Select1st<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>,ASDCP::MXF::ci_comp,std::allocator<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>>
              *)this_00,&local_390);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>
  ::~pair(&local_390);
  std::__cxx11::string::~string((string *)&local_3e0);
  std::__cxx11::string::~string((string *)name_buf);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)name_buf,"5.1EX",(allocator<char> *)symbol_buf);
  pMVar1 = Dictionary::Type((this->super_ASDCP_MCAConfigParser).m_Dict,MDD_IMFAudioSoundfield_51EX);
  local_250.super_Identifier<16U>.m_HasValue = true;
  local_250.super_Identifier<16U>.m_Value._0_8_ = *(undefined8 *)pMVar1->ul;
  local_250.super_Identifier<16U>.m_Value._8_8_ = *(undefined8 *)(pMVar1->ul + 8);
  local_250.super_Identifier<16U>.super_IArchive._vptr_IArchive =
       (_func_int **)&PTR__IArchive_002112c8;
  label_traits::label_traits(&local_3e0,(string *)name_buf,true,&local_250);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>
  ::pair<const_char_(&)[5],_ASDCP::MXF::label_traits,_true>
            (&local_390,(char (*) [5])0x1d77c5,&local_3e0);
  std::
  _Rb_tree<std::__cxx11::string_const,std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>,std::_Select1st<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>,ASDCP::MXF::ci_comp,std::allocator<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>
            ((_Rb_tree<std::__cxx11::string_const,std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>,std::_Select1st<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>,ASDCP::MXF::ci_comp,std::allocator<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>>
              *)this_00,&local_390);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>
  ::~pair(&local_390);
  std::__cxx11::string::~string((string *)&local_3e0);
  std::__cxx11::string::~string((string *)name_buf);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)name_buf,"Hearing Accessibility",(allocator<char> *)symbol_buf);
  pMVar1 = Dictionary::Type((this->super_ASDCP_MCAConfigParser).m_Dict,MDD_IMFAudioSoundfield_HI);
  local_270.super_Identifier<16U>.m_HasValue = true;
  local_270.super_Identifier<16U>.m_Value._0_8_ = *(undefined8 *)pMVar1->ul;
  local_270.super_Identifier<16U>.m_Value._8_8_ = *(undefined8 *)(pMVar1->ul + 8);
  local_270.super_Identifier<16U>.super_IArchive._vptr_IArchive =
       (_func_int **)&PTR__IArchive_002112c8;
  label_traits::label_traits(&local_3e0,(string *)name_buf,true,&local_270);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>
  ::pair<const_char_(&)[3],_ASDCP::MXF::label_traits,_true>
            (&local_390,(char (*) [3])"HA",&local_3e0);
  std::
  _Rb_tree<std::__cxx11::string_const,std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>,std::_Select1st<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>,ASDCP::MXF::ci_comp,std::allocator<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>
            ((_Rb_tree<std::__cxx11::string_const,std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>,std::_Select1st<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>,ASDCP::MXF::ci_comp,std::allocator<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>>
              *)this_00,&local_390);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>
  ::~pair(&local_390);
  std::__cxx11::string::~string((string *)&local_3e0);
  std::__cxx11::string::~string((string *)name_buf);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)name_buf,"Visual Accessibility",(allocator<char> *)symbol_buf);
  pMVar1 = Dictionary::Type((this->super_ASDCP_MCAConfigParser).m_Dict,MDD_IMFAudioSoundfield_VIN);
  local_290.super_Identifier<16U>.m_HasValue = true;
  local_290.super_Identifier<16U>.m_Value._0_8_ = *(undefined8 *)pMVar1->ul;
  local_290.super_Identifier<16U>.m_Value._8_8_ = *(undefined8 *)(pMVar1->ul + 8);
  local_290.super_Identifier<16U>.super_IArchive._vptr_IArchive =
       (_func_int **)&PTR__IArchive_002112c8;
  label_traits::label_traits(&local_3e0,(string *)name_buf,true,&local_290);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>
  ::pair<const_char_(&)[3],_ASDCP::MXF::label_traits,_true>
            (&local_390,(char (*) [3])"VA",&local_3e0);
  std::
  _Rb_tree<std::__cxx11::string_const,std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>,std::_Select1st<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>,ASDCP::MXF::ci_comp,std::allocator<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>
            ((_Rb_tree<std::__cxx11::string_const,std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>,std::_Select1st<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>,ASDCP::MXF::ci_comp,std::allocator<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>>
              *)this_00,&local_390);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>
  ::~pair(&local_390);
  std::__cxx11::string::~string((string *)&local_3e0);
  std::__cxx11::string::~string((string *)name_buf);
  pMVar1 = Dictionary::Type((this->super_ASDCP_MCAConfigParser).m_Dict,MDD_IMFNumberedSourceChannel)
  ;
  abStack_2e0._0_5_ = (undefined5)((ulong)*(undefined8 *)(pMVar1->ul + 5) >> 0x18);
  abStack_2e8 = SUB85(*(undefined8 *)pMVar1->ul,0);
  local_2e3 = SUB83((ulong)*(undefined8 *)pMVar1->ul >> 0x28,0);
  local_394._0_2_ = *(undefined2 *)(pMVar1->ul + 0xe);
  for (uVar2 = 1; uVar2 != 0x80; uVar2 = uVar2 + 1) {
    snprintf(name_buf,0x40,"Numbered Source Channel %03d",(ulong)uVar2);
    snprintf(symbol_buf,0x40,"NSC%03d",(ulong)uVar2);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_2b0,name_buf,&local_391);
    local_2d0.super_Identifier<16U>.m_HasValue = true;
    local_2d0.super_Identifier<16U>.m_Value[8] = abStack_2e0[0];
    local_2d0.super_Identifier<16U>.m_Value[9] = abStack_2e0[1];
    local_2d0.super_Identifier<16U>.m_Value[10] = abStack_2e0[2];
    local_2d0.super_Identifier<16U>.m_Value[0xb] = abStack_2e0[3];
    local_2d0.super_Identifier<16U>.m_Value[0xc] = abStack_2e0[4];
    local_2d0.super_Identifier<16U>.m_Value[0] = abStack_2e8[0];
    local_2d0.super_Identifier<16U>.m_Value[1] = abStack_2e8[1];
    local_2d0.super_Identifier<16U>.m_Value[2] = abStack_2e8[2];
    local_2d0.super_Identifier<16U>.m_Value[3] = abStack_2e8[3];
    local_2d0.super_Identifier<16U>.m_Value[4] = abStack_2e8[4];
    local_2d0.super_Identifier<16U>.m_Value[5] = local_2e3[0];
    local_2d0.super_Identifier<16U>.m_Value[6] = local_2e3[1];
    local_2d0.super_Identifier<16U>.m_Value[7] = local_2e3[2];
    local_2d0.super_Identifier<16U>.m_Value[0xd] = (byte_t)uVar2;
    local_2d0.super_Identifier<16U>.m_Value[0xe] = local_394[0];
    local_2d0.super_Identifier<16U>.m_Value[0xf] = local_394[1];
    local_2d0.super_Identifier<16U>.super_IArchive._vptr_IArchive =
         (_func_int **)&PTR__IArchive_002112c8;
    label_traits::label_traits(&local_3e0,&local_2b0,true,&local_2d0);
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>
    ::pair<char_(&)[64],_ASDCP::MXF::label_traits,_true>(&local_390,&symbol_buf,&local_3e0);
    std::
    _Rb_tree<std::__cxx11::string_const,std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>,std::_Select1st<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>,ASDCP::MXF::ci_comp,std::allocator<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>>
    ::_M_insert_unique<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>
              ((_Rb_tree<std::__cxx11::string_const,std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>,std::_Select1st<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>,ASDCP::MXF::ci_comp,std::allocator<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>>
                *)this_00,&local_390);
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>
    ::~pair(&local_390);
    std::__cxx11::string::~string((string *)&local_3e0);
    std::__cxx11::string::~string((string *)&local_2b0);
  }
  return;
}

Assistant:

ASDCP::MXF::AS02_MCAConfigParser::AS02_MCAConfigParser(const Dictionary* d) : ASDCP::MXF::ASDCP_MCAConfigParser(d)
{
  typedef mca_label_map_t::value_type pair;
  m_LabelMap.insert(pair("M1",    label_traits("Mono One",  true,  m_Dict->ul(MDD_IMFAudioChannel_M1))));
  m_LabelMap.insert(pair("M2",    label_traits("Mono Two",  true,  m_Dict->ul(MDD_IMFAudioChannel_M2))));
  m_LabelMap.insert(pair("Lt",    label_traits("Left Total",  true,  m_Dict->ul(MDD_IMFAudioChannel_Lt))));
  m_LabelMap.insert(pair("Rt",    label_traits("Right Total",  true,  m_Dict->ul(MDD_IMFAudioChannel_Rt))));
  m_LabelMap.insert(pair("Lst",   label_traits("Left Surround Total", true,  m_Dict->ul(MDD_IMFAudioChannel_Lst))));
  m_LabelMap.insert(pair("Rst",   label_traits("Right Surround Total", true,  m_Dict->ul(MDD_IMFAudioChannel_Rst))));
  m_LabelMap.insert(pair("S",     label_traits("Surround",   true,  m_Dict->ul(MDD_IMFAudioChannel_S))));
  m_LabelMap.insert(pair("ST",    label_traits("Standard Stereo",  true,  m_Dict->ul(MDD_IMFAudioSoundfield_ST))));
  m_LabelMap.insert(pair("DM",    label_traits("Dual Mono",  true,  m_Dict->ul(MDD_IMFAudioSoundfield_DM))));
  m_LabelMap.insert(pair("DNS",   label_traits("Discrete Numbered Sources", true,  m_Dict->ul(MDD_IMFAudioSoundfield_DNS))));
  m_LabelMap.insert(pair("30",    label_traits("3.0",  true,  m_Dict->ul(MDD_IMFAudioSoundfield_30))));
  m_LabelMap.insert(pair("40",    label_traits("4.0",  true,  m_Dict->ul(MDD_IMFAudioSoundfield_40))));
  m_LabelMap.insert(pair("50",    label_traits("5.0",  true,  m_Dict->ul(MDD_IMFAudioSoundfield_50))));
  m_LabelMap.insert(pair("60",    label_traits("6.0",  true,  m_Dict->ul(MDD_IMFAudioSoundfield_60))));
  m_LabelMap.insert(pair("70",    label_traits("7.0DS",  true,  m_Dict->ul(MDD_IMFAudioSoundfield_70))));
  m_LabelMap.insert(pair("LtRt",  label_traits("Lt-Rt",true,  m_Dict->ul(MDD_IMFAudioSoundfield_LtRt))));
  m_LabelMap.insert(pair("51EX",  label_traits("5.1EX",true,  m_Dict->ul(MDD_IMFAudioSoundfield_51EX))));
  m_LabelMap.insert(pair("HA",    label_traits("Hearing Accessibility",  true,  m_Dict->ul(MDD_IMFAudioSoundfield_HI))));
  m_LabelMap.insert(pair("VA",   label_traits("Visual Accessibility", true,  m_Dict->ul(MDD_IMFAudioSoundfield_VIN))));

  // assemble the  set of Numbered Source Channel labels
  char name_buf[64], symbol_buf[64];
  byte_t ul_buf[16];
  memcpy(ul_buf, m_Dict->ul(MDD_IMFNumberedSourceChannel), 16);

  for ( int i = 1; i < 128; ++i )
    {
      snprintf(name_buf, 64, "Numbered Source Channel %03d", i);
      snprintf(symbol_buf, 64, "NSC%03d", i);
      ul_buf[13] = i;
      m_LabelMap.insert(pair(symbol_buf, label_traits(name_buf, true, UL(ul_buf))));
    }
}